

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O1

void __thiscall
QTriangulator<unsigned_short>::MonotoneToTriangles::decompose(MonotoneToTriangles *this)

{
  undefined1 *puVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  QPodPoint *pQVar6;
  unsigned_short *puVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  QTriangulator<unsigned_short> *pQVar19;
  int iVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  long in_FS_OFFSET;
  QDataBuffer<int> local_78;
  QArrayDataPointer<unsigned_short> local_58;
  ushort local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (unsigned_short *)0x0;
  local_58.size = 0;
  local_78.buffer = (int *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QDataBuffer<int>::QDataBuffer(&local_78,(this->m_parent->m_indices).d.size);
  this->m_first = 0;
  pQVar19 = this->m_parent;
  if (2 < (ulong)(pQVar19->m_indices).d.size) {
    iVar16 = 0;
    do {
      uVar12 = 0;
      do {
        uVar11 = uVar12;
        uVar12 = uVar11 + 1;
      } while ((pQVar19->m_indices).d.ptr[(long)iVar16 + uVar11] != 0xffff);
      iVar15 = (int)uVar11;
      this->m_length = iVar15;
      iVar14 = (int)(uVar11 + 1);
      if (uVar11 < 3) {
        iVar16 = iVar16 + iVar14;
      }
      else {
        pQVar6 = (pQVar19->m_vertices).buffer;
        puVar7 = (pQVar19->m_indices).d.ptr;
        uVar12 = 0;
        do {
          uVar11 = uVar12;
          uVar12 = (long)((int)uVar11 + 1) % (long)iVar15;
          bVar8 = pQVar6[puVar7[(int)uVar12 + iVar16]].y < pQVar6[puVar7[(int)uVar11 + iVar16]].y;
          if (pQVar6[puVar7[(int)uVar12 + iVar16]].y == pQVar6[puVar7[(int)uVar11 + iVar16]].y) {
            bVar8 = pQVar6[puVar7[(int)uVar12 + iVar16]].x < pQVar6[puVar7[(int)uVar11 + iVar16]].x;
          }
          uVar12 = uVar12 & 0xffffffff;
        } while (bVar8);
        do {
          iVar5 = (int)uVar11;
          uVar12 = (long)(iVar14 + -2 + iVar5) % (long)iVar15;
          uVar11 = uVar12 & 0xffffffff;
          bVar8 = pQVar6[puVar7[(int)uVar12 + iVar16]].y < pQVar6[puVar7[iVar5 + iVar16]].y;
          if (pQVar6[puVar7[(int)uVar12 + iVar16]].y == pQVar6[puVar7[iVar5 + iVar16]].y) {
            bVar8 = pQVar6[puVar7[(int)uVar12 + iVar16]].x < pQVar6[puVar7[iVar5 + iVar16]].x;
          }
        } while (bVar8);
        local_78.siz = 0;
        QDataBuffer<int>::reserve(&local_78,1);
        local_78.buffer[local_78.siz] = iVar5;
        iVar16 = this->m_length;
        uVar12 = (long)(iVar5 + -1 + iVar16) % (long)iVar16;
        uVar11 = (long)(iVar5 + 1) % (long)iVar16;
        iVar16 = this->m_first;
        pQVar6 = (this->m_parent->m_vertices).buffer;
        puVar7 = (this->m_parent->m_indices).d.ptr;
        iVar20 = (int)uVar12;
        iVar13 = (int)uVar11;
        iVar14 = pQVar6[puVar7[iVar20 + iVar16]].x;
        iVar15 = pQVar6[puVar7[iVar20 + iVar16]].y;
        iVar4 = pQVar6[puVar7[iVar5 + iVar16]].x;
        iVar5 = pQVar6[puVar7[iVar5 + iVar16]].y;
        iVar22 = pQVar6[puVar7[iVar16 + iVar13]].x - iVar14;
        iVar10 = pQVar6[puVar7[iVar16 + iVar13]].y - iVar15;
        bVar8 = iVar10 != 0 && iVar15 <= pQVar6[puVar7[iVar16 + iVar13]].y;
        if (iVar10 == 0) {
          bVar8 = iVar22 != 0 && iVar14 <= pQVar6[puVar7[iVar16 + iVar13]].x;
        }
        lVar17 = local_78.siz + 2;
        local_78.siz = local_78.siz + 1;
        QDataBuffer<int>::reserve(&local_78,lVar17);
        puVar1 = (undefined1 *)(local_78.siz + 1);
        if (!bVar8) {
          local_78.buffer[local_78.siz] = iVar13;
          uVar11 = (long)(iVar13 + 1) % (long)this->m_length;
        }
        else {
          local_78.buffer[local_78.siz] = iVar20;
          uVar12 = (long)(iVar20 + this->m_length + -1) % (long)this->m_length;
        }
        uVar12 = uVar12 & 0xffffffff;
        bVar8 = bVar8;
        iVar16 = this->m_length;
        local_78.siz = (qsizetype)puVar1;
        if (2 < iVar16) {
          lVar23 = (long)iVar22 * ((long)iVar5 - (long)iVar15);
          lVar17 = (long)iVar10 * ((long)iVar4 - (long)iVar14);
          iVar14 = 0;
          do {
            uVar21 = uVar11 & 0xffffffff;
            iVar16 = (int)uVar12;
            pQVar6 = (this->m_parent->m_vertices).buffer;
            puVar7 = (this->m_parent->m_indices).d.ptr;
            uVar2 = puVar7[this->m_first + iVar16];
            iVar15 = (int)uVar11;
            uVar3 = puVar7[this->m_first + iVar15];
            bVar9 = pQVar6[uVar2].y < pQVar6[uVar3].y;
            if (pQVar6[uVar2].y == pQVar6[uVar3].y) {
              bVar9 = pQVar6[uVar2].x < pQVar6[uVar3].x;
            }
            if (bVar9) {
              if (bVar8) {
                if (1 < local_78.siz) {
                  do {
                    lVar18 = (long)this->m_first;
                    pQVar6 = (this->m_parent->m_vertices).buffer;
                    puVar7 = (this->m_parent->m_indices).d.ptr;
                    uVar2 = puVar7[local_78.buffer[(long)(local_78.siz + -2)] + lVar18];
                    if (((long)pQVar6[puVar7[lVar18 + iVar16]].y - (long)pQVar6[uVar2].y) *
                        ((long)pQVar6[puVar7[local_78.buffer[(long)(local_78.siz + -1)] + lVar18]].x
                        - (long)pQVar6[uVar2].x) <
                        ((long)pQVar6[puVar7[lVar18 + iVar16]].x - (long)pQVar6[uVar2].x) *
                        ((long)pQVar6[puVar7[local_78.buffer[(long)(local_78.siz + -1)] + lVar18]].y
                        - (long)pQVar6[uVar2].y) != lVar23 < lVar17) break;
                    local_3a = uVar2;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar16]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first +
                                (long)local_78.buffer[(long)(local_78.siz + -1)]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    puVar1 = (undefined1 *)(local_78.siz + -1);
                    bVar8 = 2 < local_78.siz;
                    local_78.siz = (qsizetype)puVar1;
                  } while (bVar8);
                }
              }
              else {
                if (1 < local_78.siz) {
                  lVar18 = 1;
                  do {
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar18]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar16]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar18 + -1]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < local_78.siz);
                }
                *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
                QDataBuffer<int>::reserve(&local_78,1);
                local_78.siz = 1;
              }
              QDataBuffer<int>::reserve(&local_78,(qsizetype)(local_78.siz + 1));
              local_78.buffer[local_78.siz] = iVar16;
              uVar12 = (long)(iVar16 + this->m_length + -1) % (long)this->m_length & 0xffffffff;
              bVar8 = true;
            }
            else {
              if (bVar8) {
                if (1 < local_78.siz) {
                  lVar18 = 1;
                  do {
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar18 + -1]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar15]
                    ;
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    local_3a = (this->m_parent->m_indices).d.ptr
                               [(long)this->m_first + (long)local_78.buffer[lVar18]];
                    QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                              ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                    QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                    lVar18 = lVar18 + 1;
                  } while (lVar18 < local_78.siz);
                }
                *local_78.buffer = local_78.buffer[(long)(local_78.siz + -1)];
                QDataBuffer<int>::reserve(&local_78,1);
                local_78.siz = 1;
              }
              else if (1 < local_78.siz) {
                do {
                  lVar18 = (long)this->m_first;
                  pQVar6 = (this->m_parent->m_vertices).buffer;
                  puVar7 = (this->m_parent->m_indices).d.ptr;
                  uVar2 = puVar7[local_78.buffer[(long)(local_78.siz + -1)] + lVar18];
                  if (((long)pQVar6[puVar7[lVar18 + iVar15]].y - (long)pQVar6[uVar2].y) *
                      ((long)pQVar6[puVar7[local_78.buffer[(long)(local_78.siz + -2)] + lVar18]].x -
                      (long)pQVar6[uVar2].x) <
                      ((long)pQVar6[puVar7[lVar18 + iVar15]].x - (long)pQVar6[uVar2].x) *
                      ((long)pQVar6[puVar7[local_78.buffer[(long)(local_78.siz + -2)] + lVar18]].y -
                      (long)pQVar6[uVar2].y) != lVar23 < lVar17) break;
                  local_3a = uVar2;
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  local_3a = (this->m_parent->m_indices).d.ptr[(long)this->m_first + (long)iVar15];
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  local_3a = (this->m_parent->m_indices).d.ptr
                             [(long)this->m_first + (long)local_78.buffer[(long)(local_78.siz + -2)]
                             ];
                  QtPrivate::QPodArrayOps<unsigned_short>::emplace<unsigned_short&>
                            ((QPodArrayOps<unsigned_short> *)&local_58,local_58.size,&local_3a);
                  QList<unsigned_short>::end((QList<unsigned_short> *)&local_58);
                  puVar1 = (undefined1 *)(local_78.siz + -1);
                  bVar8 = 2 < local_78.siz;
                  local_78.siz = (qsizetype)puVar1;
                } while (bVar8);
              }
              QDataBuffer<int>::reserve(&local_78,(qsizetype)(local_78.siz + 1));
              local_78.buffer[local_78.siz] = iVar15;
              uVar21 = (long)(iVar15 + 1) % (long)this->m_length;
              bVar8 = false;
            }
            local_78.siz = local_78.siz + 1;
            iVar15 = iVar14 + 3;
            iVar16 = this->m_length;
            iVar14 = iVar14 + 1;
            uVar11 = uVar21;
          } while (iVar15 < iVar16);
        }
        iVar16 = iVar16 + this->m_first + 1;
      }
      this->m_first = iVar16;
      pQVar19 = this->m_parent;
    } while ((long)(iVar16 + 3) <= (pQVar19->m_indices).d.size);
  }
  QArrayDataPointer<unsigned_short>::operator=(&(pQVar19->m_indices).d,&local_58);
  if (local_78.buffer != (int *)0x0) {
    QtPrivate::sizedFree(local_78.buffer,local_78.capacity << 2);
  }
  if (&(local_58.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTriangulator<T>::MonotoneToTriangles::decompose()
{
    QList<T> result;
    QDataBuffer<int> stack(m_parent->m_indices.size());
    m_first = 0;
    // Require at least three more indices.
    while (m_first + 3 <= m_parent->m_indices.size()) {
        m_length = 0;
        while (m_parent->m_indices.at(m_first + m_length) != T(-1)) { // Q_TRIANGULATE_END_OF_POLYGON
            ++m_length;
            Q_ASSERT(m_first + m_length < m_parent->m_indices.size());
        }
        if (m_length < 3) {
            m_first += m_length + 1;
            continue;
        }

        int minimum = 0;
        while (less(next(minimum), minimum))
            minimum = next(minimum);
        while (less(previous(minimum), minimum))
            minimum = previous(minimum);

        stack.reset();
        stack.add(minimum);
        int left = previous(minimum);
        int right = next(minimum);
        bool stackIsOnLeftSide;
        bool clockwiseOrder = leftOfEdge(minimum, left, right);

        if (less(left, right)) {
            stack.add(left);
            left = previous(left);
            stackIsOnLeftSide = true;
        } else {
            stack.add(right);
            right = next(right);
            stackIsOnLeftSide = false;
        }

        for (int count = 0; count + 2 < m_length; ++count)
        {
            Q_ASSERT(stack.size() >= 2);
            if (less(left, right)) {
                if (stackIsOnLeftSide == false) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i + 1)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.at(i)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(left, stack.at(stack.size() - 2), stack.last()))) {
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        result.push_back(indices(left));
                        result.push_back(indices(stack.last()));
                        stack.pop_back();
                    }
                }
                stack.add(left);
                left = previous(left);
                stackIsOnLeftSide = true;
            } else {
                if (stackIsOnLeftSide == true) {
                    for (int i = 0; i + 1 < stack.size(); ++i) {
                        result.push_back(indices(stack.at(i)));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(i + 1)));
                    }
                    stack.first() = stack.last();
                    stack.resize(1);
                } else {
                    while (stack.size() >= 2 && (clockwiseOrder ^ !leftOfEdge(right, stack.last(), stack.at(stack.size() - 2)))) {
                        result.push_back(indices(stack.last()));
                        result.push_back(indices(right));
                        result.push_back(indices(stack.at(stack.size() - 2)));
                        stack.pop_back();
                    }
                }
                stack.add(right);
                right = next(right);
                stackIsOnLeftSide = false;
            }
        }

        m_first += m_length + 1;
    }
    m_parent->m_indices = result;
}